

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

lyxp_expr * lyxp_parse_expr(char *expr)

{
  byte *__s1;
  byte bVar1;
  bool bVar2;
  ushort uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  lyxp_expr *expr_00;
  char *pcVar8;
  lyxp_token *plVar9;
  uint16_t *puVar10;
  uint8_t *puVar11;
  ushort **ppuVar12;
  ulong uVar13;
  uint8_t **ppuVar14;
  LY_ERR *pLVar15;
  lyxp_token lVar16;
  long lVar17;
  ushort uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  
  expr_00 = (lyxp_expr *)calloc(1,0x30);
  if (expr_00 != (lyxp_expr *)0x0) {
    pcVar8 = strdup(expr);
    expr_00->expr = pcVar8;
    if (pcVar8 != (char *)0x0) {
      expr_00->used = 0;
      expr_00->size = 10;
      plVar9 = (lyxp_token *)malloc(0x28);
      expr_00->tokens = plVar9;
      if (plVar9 != (lyxp_token *)0x0) {
        puVar10 = (uint16_t *)malloc(0x14);
        expr_00->expr_pos = puVar10;
        if (puVar10 != (uint16_t *)0x0) {
          puVar11 = (uint8_t *)malloc(10);
          expr_00->tok_len = puVar11;
          if (puVar11 != (uint8_t *)0x0) {
            uVar18 = 0;
            while (((ulong)(byte)expr[uVar18] < 0x21 &&
                   ((0x100002600U >> ((ulong)(byte)expr[uVar18] & 0x3f) & 1) != 0))) {
              uVar18 = uVar18 + 1;
            }
            bVar2 = false;
            do {
              uVar13 = (ulong)uVar18;
              bVar1 = expr[uVar13];
              uVar20 = 1;
              uVar4 = 1;
              uVar19 = 1;
              uVar5 = uVar19;
              if (bVar1 < 0x5b) {
                if (bVar1 == 0x28) {
                  if (bVar2) {
                    uVar13 = (ulong)expr_00->used;
                    lVar16 = LYXP_TOKEN_PAR1;
                    if (uVar13 != 0) {
                      plVar9 = expr_00->tokens;
                      uVar7 = expr_00->used - 1;
                      if (plVar9[uVar7] == LYXP_TOKEN_NAMETEST) {
                        puVar11 = expr_00->tok_len;
                        if (puVar11[uVar7] == '\x04') {
                          uVar3 = expr_00->expr_pos[uVar7];
                          iVar6 = strncmp(expr + uVar3,"node",4);
                          if ((iVar6 != 0) && (iVar6 = strncmp(expr + uVar3,"text",4), iVar6 != 0))
                          goto LAB_00166e17;
LAB_00166eb2:
                          plVar9[uVar13 - 1] = LYXP_TOKEN_NODETYPE;
                        }
                        else {
LAB_00166e17:
                          if ((puVar11[uVar13 - 1] == '\a') &&
                             (iVar6 = strncmp(expr + expr_00->expr_pos[uVar13 - 1],"comment",7),
                             iVar6 == 0)) goto LAB_00166eb2;
                          plVar9[uVar13 - 1] = LYXP_TOKEN_FUNCNAME;
                        }
                        lVar16 = LYXP_TOKEN_PAR1;
                        bVar2 = false;
                        goto LAB_00166fc8;
                      }
                    }
                    bVar2 = true;
                  }
                  else {
                    lVar16 = LYXP_TOKEN_PAR1;
                    bVar2 = false;
                  }
                }
                else {
                  lVar16 = LYXP_TOKEN_PAR2;
                  if (bVar1 != 0x29) {
LAB_00166cf2:
                    __s1 = (byte *)(expr + uVar13);
                    iVar6 = strncmp((char *)__s1,"..",2);
                    if (iVar6 == 0) {
                      lVar16 = LYXP_TOKEN_DDOT;
LAB_00166e70:
                      uVar5 = 2;
                    }
                    else {
                      uVar5 = uVar20;
                      if (bVar1 < 0x2c) {
                        if (bVar1 == 0x22) {
                          uVar5 = 1;
                          do {
                            uVar13 = (ulong)uVar5;
                            uVar5 = uVar5 + 1;
                            lVar16 = LYXP_TOKEN_LITERAL;
                          } while (__s1[uVar13] != 0x22);
                        }
                        else if (bVar1 == 0x27) {
                          uVar5 = 1;
                          do {
                            uVar13 = (ulong)uVar5;
                            uVar5 = uVar5 + 1;
                            lVar16 = LYXP_TOKEN_LITERAL;
                          } while (__s1[uVar13] != 0x27);
                        }
                        else {
LAB_00166f10:
                          ppuVar12 = __ctype_b_loc();
                          if ((*(byte *)((long)*ppuVar12 + (long)(char)bVar1 * 2 + 1) & 8) == 0) {
                            if (bVar1 == 0x2f) {
                              iVar6 = strncmp((char *)__s1,"//",2);
                              lVar16 = LYXP_TOKEN_OPERATOR_PATH;
                              uVar5 = (iVar6 == 0) + 1;
                            }
                            else {
                              iVar6 = strncmp((char *)__s1,"!=",2);
                              lVar16 = LYXP_TOKEN_OPERATOR_COMP;
                              if (iVar6 == 0) goto LAB_00166e70;
                              iVar6 = strncmp((char *)__s1,"<=",2);
                              if ((iVar6 == 0) || (iVar6 = strncmp((char *)__s1,">=",2), iVar6 == 0)
                                 ) {
                                uVar4 = 2;
LAB_0016711f:
                                lVar16 = LYXP_TOKEN_OPERATOR_COMP;
                                uVar5 = uVar4;
                              }
                              else {
                                uVar7 = (uint)bVar1;
                                if (bVar1 < 0x3c) {
                                  if ((uVar7 == 0x2b) || (uVar7 == 0x2d)) {
                                    lVar16 = LYXP_TOKEN_OPERATOR_MATH;
                                  }
                                  else {
LAB_00167140:
                                    if ((expr_00->used == 0) ||
                                       ((expr_00->tokens[expr_00->used - 1] < LYXP_TOKEN_LITERAL &&
                                        ((0x1f18aU >>
                                          (expr_00->tokens[expr_00->used - 1] &
                                          (LYXP_TOKEN_OPERATOR_PATH|LYXP_TOKEN_OPERATOR_UNI)) & 1)
                                         != 0)))) {
                                      if (bVar1 != 0x2a) {
                                        uVar4 = parse_ncname((char *)__s1);
                                        if (uVar4 == 0) {
LAB_001672d0:
                                          bVar1 = *__s1;
LAB_001672e1:
                                          ly_vlog(LYE_INCHAR,LY_VLOG_NONE,(void *)0x0,
                                                  (ulong)(uint)(int)(char)bVar1,__s1);
                                          goto LAB_001672b4;
                                        }
                                        if (expr[uVar4 + uVar13] == ':') {
                                          lVar17 = uVar13 + (ushort)(uVar4 + 1);
                                          if (expr[lVar17] == '*') {
                                            uVar4 = uVar4 + 2;
                                          }
                                          else {
                                            uVar5 = parse_ncname(expr + lVar17);
                                            if (uVar5 == 0) goto LAB_001672d0;
                                            uVar4 = uVar5 + uVar4 + 1;
                                          }
                                          bVar2 = false;
                                        }
                                        else {
                                          bVar2 = true;
                                        }
                                      }
                                      lVar16 = LYXP_TOKEN_NAMETEST;
                                      uVar5 = uVar4;
                                    }
                                    else if (bVar1 == 0x2a) {
LAB_001671e8:
                                      lVar16 = LYXP_TOKEN_OPERATOR_MATH;
                                      uVar5 = uVar4;
                                    }
                                    else {
                                      iVar6 = strncmp((char *)__s1,"or",2);
                                      if (iVar6 == 0) {
                                        uVar5 = 2;
                                      }
                                      else {
                                        iVar6 = strncmp((char *)__s1,"and",3);
                                        uVar5 = 3;
                                        uVar4 = 3;
                                        if (iVar6 != 0) {
                                          iVar6 = strncmp((char *)__s1,"mod",3);
                                          if (iVar6 != 0) {
                                            iVar6 = strncmp((char *)__s1,"div",3);
                                            lVar16 = LYXP_TOKEN_OPERATOR_MATH;
                                            uVar5 = 3;
                                            if (iVar6 == 0) goto LAB_00166fc8;
                                            goto LAB_001672e1;
                                          }
                                          goto LAB_001671e8;
                                        }
                                      }
                                      lVar16 = LYXP_TOKEN_OPERATOR_LOG;
                                    }
                                  }
                                }
                                else {
                                  if (uVar7 - 0x3c < 3) goto LAB_0016711f;
                                  if (uVar7 != 0x7c) goto LAB_00167140;
                                  lVar16 = LYXP_TOKEN_OPERATOR_UNI;
                                  uVar5 = uVar19;
                                }
                              }
                            }
                          }
                          else {
LAB_00166f7c:
                            ppuVar12 = __ctype_b_loc();
                            uVar5 = 0xffff;
                            do {
                              uVar5 = uVar5 + 1;
                            } while ((*(byte *)((long)*ppuVar12 + (long)expr[uVar5 + uVar13] * 2 + 1
                                               ) & 8) != 0);
                            lVar16 = LYXP_TOKEN_NUMBER;
                            if (expr[uVar5 + uVar13] == '.') {
                              do {
                                uVar5 = uVar5 + 1;
                              } while ((*(byte *)((long)*ppuVar12 +
                                                 (long)expr[uVar5 + uVar13] * 2 + 1) & 8) != 0);
                            }
                          }
                        }
                      }
                      else if (bVar1 == 0x2c) {
                        lVar16 = LYXP_TOKEN_COMMA;
                      }
                      else {
                        lVar16 = LYXP_TOKEN_AT;
                        if (bVar1 != 0x40) {
                          if (bVar1 != 0x2e) goto LAB_00166f10;
                          ppuVar12 = __ctype_b_loc();
                          if ((*(byte *)((long)*ppuVar12 + (long)(char)__s1[1] * 2 + 1) & 8) != 0)
                          goto LAB_00166f7c;
                          lVar16 = LYXP_TOKEN_DOT;
                        }
                      }
                    }
                  }
                }
              }
              else if (bVar1 == 0x5b) {
                lVar16 = LYXP_TOKEN_BRACK1;
              }
              else {
                if (bVar1 != 0x5d) goto LAB_00166cf2;
                lVar16 = LYXP_TOKEN_BRACK2;
              }
LAB_00166fc8:
              if (expr_00->used == expr_00->size) {
                uVar3 = expr_00->size + 5;
                expr_00->size = uVar3;
                plVar9 = (lyxp_token *)ly_realloc(expr_00->tokens,(ulong)uVar3 << 2);
                expr_00->tokens = plVar9;
                if (plVar9 != (lyxp_token *)0x0) {
                  puVar10 = (uint16_t *)
                            ly_realloc(expr_00->expr_pos,(ulong)((uint)expr_00->size * 2));
                  expr_00->expr_pos = puVar10;
                  if (puVar10 != (uint16_t *)0x0) {
                    puVar11 = (uint8_t *)ly_realloc(expr_00->tok_len,(ulong)expr_00->size);
                    expr_00->tok_len = puVar11;
                    if (puVar11 != (uint8_t *)0x0) goto LAB_00167029;
                  }
                }
                pLVar15 = ly_errno_location();
                *pLVar15 = LY_EMEM;
                ly_log(LY_LLERR,"Memory allocation failed (%s()).","exp_add_token");
              }
              else {
LAB_00167029:
                uVar3 = expr_00->used;
                expr_00->tokens[uVar3] = lVar16;
                expr_00->expr_pos[uVar3] = uVar18;
                expr_00->tok_len[expr_00->used] = (uint8_t)uVar5;
                expr_00->used = expr_00->used + 1;
              }
              uVar18 = uVar5 + uVar18;
              while (uVar13 = (ulong)(byte)expr[uVar18], uVar13 < 0x21) {
                if ((0x100002600U >> (uVar13 & 0x3f) & 1) == 0) {
                  if (uVar13 == 0) {
                    ppuVar14 = (uint8_t **)calloc((ulong)expr_00->size,8);
                    expr_00->repeat = ppuVar14;
                    if (ppuVar14 != (uint8_t **)0x0) {
                      return expr_00;
                    }
                    goto LAB_00167292;
                  }
                  break;
                }
                uVar18 = uVar18 + 1;
              }
            } while( true );
          }
        }
      }
    }
  }
LAB_00167292:
  pLVar15 = ly_errno_location();
  *pLVar15 = LY_EMEM;
  ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyxp_parse_expr");
LAB_001672b4:
  lyxp_expr_free(expr_00);
  return (lyxp_expr *)0x0;
}

Assistant:

struct lyxp_expr *
lyxp_parse_expr(const char *expr)
{
    struct lyxp_expr *ret;
    uint16_t parsed = 0, tok_len, ncname_len;
    enum lyxp_token tok_type;
    int prev_function_check = 0;

    /* init lyxp_expr structure */
    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        goto error;
    }
    ret->expr = strdup(expr);
    if (!ret->expr) {
        LOGMEM;
        goto error;
    }
    ret->used = 0;
    ret->size = LYXP_EXPR_SIZE_START;
    ret->tokens = malloc(ret->size * sizeof *ret->tokens);
    if (!ret->tokens) {
        LOGMEM;
        goto error;
    }
    ret->expr_pos = malloc(ret->size * sizeof *ret->expr_pos);
    if (!ret->expr_pos) {
        LOGMEM;
        goto error;
    }
    ret->tok_len = malloc(ret->size * sizeof *ret->tok_len);
    if (!ret->tok_len) {
        LOGMEM;
        goto error;
    }

    while (is_xmlws(expr[parsed])) {
        ++parsed;
    }

    do {
        if (expr[parsed] == '(') {

            /* '(' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR1;

            if (prev_function_check && ret->used && (ret->tokens[ret->used - 1] == LYXP_TOKEN_NAMETEST)) {
                /* it is a NodeType/FunctionName after all */
                if (((ret->tok_len[ret->used - 1] == 4)
                        && (!strncmp(&expr[ret->expr_pos[ret->used - 1]], "node", 4)
                        || !strncmp(&expr[ret->expr_pos[ret->used - 1]], "text", 4))) ||
                        ((ret->tok_len[ret->used - 1] == 7)
                        && !strncmp(&expr[ret->expr_pos[ret->used - 1]], "comment", 7))) {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_NODETYPE;
                } else {
                    ret->tokens[ret->used - 1] = LYXP_TOKEN_FUNCNAME;
                }
                prev_function_check = 0;
            }

        } else if (expr[parsed] == ')') {

            /* ')' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_PAR2;

        } else if (expr[parsed] == '[') {

            /* '[' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK1;

        } else if (expr[parsed] == ']') {

            /* ']' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_BRACK2;

        } else if (!strncmp(&expr[parsed], "..", 2)) {

            /* '..' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_DDOT;

        } else if ((expr[parsed] == '.') && (!isdigit(expr[parsed+1]))) {

            /* '.' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_DOT;

        } else if (expr[parsed] == '@') {

            /* '@' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_AT;

        } else if (expr[parsed] == ',') {

            /* ',' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_COMMA;

        } else if (expr[parsed] == '\'') {

            /* Literal with ' */
            for (tok_len = 1; expr[parsed + tok_len] != '\''; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if (expr[parsed] == '\"') {

            /* Literal with " */
            for (tok_len = 1; expr[parsed + tok_len] != '\"'; ++tok_len);
            ++tok_len;
            tok_type = LYXP_TOKEN_LITERAL;

        } else if ((expr[parsed] == '.') || (isdigit(expr[parsed]))) {

            /* Number */
            for (tok_len = 0; isdigit(expr[parsed + tok_len]); ++tok_len);
            if (expr[parsed + tok_len] == '.') {
                ++tok_len;
                for (; isdigit(expr[parsed + tok_len]); ++tok_len);
            }
            tok_type = LYXP_TOKEN_NUMBER;

        } else if (expr[parsed] == '/') {

            /* Operator '/', '//' */
            if (!strncmp(&expr[parsed], "//", 2)) {
                tok_len = 2;
            } else {
                tok_len = 1;
            }
            tok_type = LYXP_TOKEN_OPERATOR_PATH;

        } else if  (!strncmp(&expr[parsed], "!=", 2) || !strncmp(&expr[parsed], "<=", 2)
                || !strncmp(&expr[parsed], ">=", 2)) {

            /* Operator '!=', '<=', '>=' */
            tok_len = 2;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (expr[parsed] == '|') {

            /* Operator '|' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_UNI;

        } else if ((expr[parsed] == '+') || (expr[parsed] == '-')) {

            /* Operator '+', '-' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_MATH;

        } else if ((expr[parsed] == '=') || (expr[parsed] == '<') || (expr[parsed] == '>')) {

            /* Operator '=', '<', '>' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_OPERATOR_COMP;

        } else if (ret->used && (ret->tokens[ret->used - 1] != LYXP_TOKEN_AT)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_PAR1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_BRACK1)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_COMMA)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_LOG)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_COMP)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_MATH)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_UNI)
                && (ret->tokens[ret->used - 1] != LYXP_TOKEN_OPERATOR_PATH)) {

            /* Operator '*', 'or', 'and', 'mod', or 'div' */
            if (expr[parsed] == '*') {
                tok_len = 1;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else if (!strncmp(&expr[parsed], "or", 2)) {
                tok_len = 2;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "and", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_LOG;

            } else if (!strncmp(&expr[parsed], "mod", 3) || !strncmp(&expr[parsed], "div", 3)) {
                tok_len = 3;
                tok_type = LYXP_TOKEN_OPERATOR_MATH;

            } else {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
        } else if (expr[parsed] == '*') {

            /* NameTest '*' */
            tok_len = 1;
            tok_type = LYXP_TOKEN_NAMETEST;

        } else {

            /* NameTest (NCName ':' '*' | QName) or NodeType/FunctionName */
            ncname_len = parse_ncname(&expr[parsed]);
            if (!ncname_len) {
                LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                goto error;
            }
            tok_len = ncname_len;

            if (expr[parsed + tok_len] == ':') {
                ++tok_len;
                if (expr[parsed + tok_len] == '*') {
                    ++tok_len;
                } else {
                    ncname_len = parse_ncname(&expr[parsed + tok_len]);
                    if (!ncname_len) {
                        LOGVAL(LYE_INCHAR, LY_VLOG_NONE, NULL, expr[parsed], &expr[parsed]);
                        goto error;
                    }
                    tok_len += ncname_len;
                }
                /* remove old flag to prevent ambiguities */
                prev_function_check = 0;
                tok_type = LYXP_TOKEN_NAMETEST;
            } else {
                /* there is no prefix so it can still be NodeType/FunctioName, we can't finally decide now */
                prev_function_check = 1;
                tok_type = LYXP_TOKEN_NAMETEST;
            }
        }

        /* store the token, move on to the next one */
        exp_add_token(ret, tok_type, parsed, tok_len);
        parsed += tok_len;
        while (is_xmlws(expr[parsed])) {
            ++parsed;
        }

    } while (expr[parsed]);

    /* prealloc repeat */
    ret->repeat = calloc(ret->size, sizeof *ret->repeat);
    if (!ret->repeat) {
        LOGMEM;
        goto error;
    }

    return ret;

error:
    lyxp_expr_free(ret);
    return NULL;
}